

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O0

int rci_read_data(nifti_image *nim,int *pivots,int *prods,int nprods,int *dims,char *data,znzFile fp
                 ,size_t base_offset)

{
  int iVar1;
  ulong uVar2;
  size_t sVar3;
  ulong uVar4;
  size_t bytes;
  size_t nread;
  long lStack_58;
  int c;
  size_t read_size;
  size_t offset;
  size_t sublen;
  char *data_local;
  int *dims_local;
  int nprods_local;
  int *prods_local;
  int *pivots_local;
  nifti_image *nim_local;
  
  if (nprods < 1) {
    fprintf(_stderr,"** rci_read_data, bad prods, %d\n",(ulong)(uint)nprods);
    nim_local._4_4_ = -1;
  }
  else if (nprods == 1) {
    if (*pivots == 0) {
      znzseek(fp,base_offset,0);
      uVar2 = (long)*prods * (long)nim->nbyper;
      sVar3 = nifti_read_buffer(fp,data,uVar2,nim);
      if (sVar3 == uVar2) {
        if (3 < g_opts.debug) {
          fprintf(_stderr,"+d successful read of %u bytes at offset %u\n",uVar2 & 0xffffffff,
                  base_offset & 0xffffffff);
        }
        nim_local._4_4_ = 0;
      }
      else {
        fprintf(_stderr,"** rciRD: read only %u of %u bytes from \'%s\'\n",sVar3 & 0xffffffff,
                uVar2 & 0xffffffff,nim->fname);
        nim_local._4_4_ = -1;
      }
    }
    else {
      fprintf(_stderr,"** rciRD: final pivot == %d!\n",(ulong)(uint)*pivots);
      nim_local._4_4_ = -1;
    }
  }
  else {
    offset = 1;
    for (nread._4_4_ = 1; nread._4_4_ < *pivots; nread._4_4_ = nread._4_4_ + 1) {
      offset = (long)nim->dim[nread._4_4_] * offset;
    }
    lStack_58 = 1;
    for (nread._4_4_ = 1; nread._4_4_ < nprods; nread._4_4_ = nread._4_4_ + 1) {
      lStack_58 = prods[nread._4_4_] * lStack_58;
    }
    uVar2 = nim->nbyper * lStack_58;
    for (nread._4_4_ = 0; nread._4_4_ < *prods; nread._4_4_ = nread._4_4_ + 1) {
      uVar4 = (long)nim->nbyper *
              ((long)nread._4_4_ * offset * (long)nim->dim[*pivots] + offset * (long)dims[*pivots]);
      if (3 < g_opts.debug) {
        fprintf(_stderr,"-d reading %u bytes, foff %u + %u, doff %u\n",uVar2 & 0xffffffff,
                base_offset & 0xffffffff,uVar4 & 0xffffffff,(ulong)(uint)(nread._4_4_ * (int)uVar2))
        ;
      }
      iVar1 = rci_read_data(nim,pivots + 1,prods + 1,nprods + -1,dims,
                            data + (long)nread._4_4_ * uVar2,fp,base_offset + uVar4);
      if (iVar1 < 0) {
        return -1;
      }
    }
    nim_local._4_4_ = 0;
  }
  return nim_local._4_4_;
}

Assistant:

static int rci_read_data(nifti_image * nim, int * pivots, int * prods,
      int nprods, const int dims[], char * data, znzFile fp, size_t base_offset)
{
   size_t sublen, offset, read_size;
   int    c;

   /* bad check first - base_offset may not have been checked */
   if( nprods <= 0 ){
      fprintf(stderr,"** rci_read_data, bad prods, %d\n", nprods);
      return -1;
   }

   /* base case: actually read the data */
   if( nprods == 1 ){
      size_t nread, bytes;

      /* make sure things look good here */
      if( *pivots != 0 ){
         fprintf(stderr,"** rciRD: final pivot == %d!\n", *pivots);
         return -1;
      }

      /* so just seek and read (prods[0] * nbyper) bytes from the file */
      znzseek(fp, (long)base_offset, SEEK_SET);
      bytes = (size_t)prods[0] * nim->nbyper;
      nread = nifti_read_buffer(fp, data, bytes, nim);
      if( nread != bytes ){
         fprintf(stderr,"** rciRD: read only %u of %u bytes from '%s'\n",
                 (unsigned)nread, (unsigned)bytes, nim->fname);
         return -1;
      } else if( g_opts.debug > 3 )
         fprintf(stderr,"+d successful read of %u bytes at offset %u\n",
                 (unsigned)bytes, (unsigned)base_offset);

      return 0;  /* done with base case - return success */
   }

   /* not the base case, so do a set of reduced reads */

   /* compute size of sub-brick: all dimensions below pivot */
   for( c = 1, sublen = 1; c < *pivots; c++ ) sublen *= nim->dim[c];

   /* compute number of values to read, i.e. remaining prods */
   for( c = 1, read_size = 1; c < nprods; c++ ) read_size *= prods[c];
   read_size *= nim->nbyper;  /* and multiply by bytes per voxel */

   /* now repeatedly compute offsets, and recursively read */
   for( c = 0; c < prods[0]; c++ ){
      /* offset is (c * sub-block size (including pivot dim))   */
      /*         + (dims[] index into pivot sub-block)          */
      /* the unneeded multiplication is to make this more clear */
      offset = (size_t)c * sublen * nim->dim[*pivots] +
               (size_t)sublen * dims[*pivots];
      offset *= nim->nbyper;

      if( g_opts.debug > 3 )
         fprintf(stderr,"-d reading %u bytes, foff %u + %u, doff %u\n",
                 (unsigned)read_size, (unsigned)base_offset, (unsigned)offset,
                 (unsigned)(c*read_size));

      /* now read the next level down, adding this offset */
      if( rci_read_data(nim, pivots+1, prods+1, nprods-1, dims,
                    data + c * read_size, fp, base_offset + offset) < 0 )
         return -1;
   }

   return 0;
}